

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O3

int nifti_write_extensions(znzFile fp,nifti_image *nim)

{
  uint uVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  ulong in_RAX;
  size_t sVar3;
  uint uVar4;
  char *__format;
  nifti1_extension *buf;
  char extdr [4];
  undefined8 uStack_38;
  
  uStack_38 = in_RAX & 0xffffffff;
  iVar2 = (int)CONCAT71((int7)(in_RAX >> 8),fp == (znzFile)0x0);
  if ((nim == (nifti_image *)0x0 || fp == (znzFile)0x0) || (iVar2 = nim->num_ext, iVar2 < 0)) {
    if (0 < g_opts_0) {
      nifti_write_extensions_cold_3();
      iVar2 = extraout_EAX_00;
    }
  }
  else if ((g_opts_1 == 0) || ((iVar2 != 0 && (nim->ext_list != (nifti1_extension *)0x0)))) {
    iVar2 = valid_nifti_extensions(nim);
    if (iVar2 == 0) {
      nim->num_ext = 0;
    }
    else if (0 < nim->num_ext) {
      uStack_38._0_5_ = CONCAT14(1,(undefined4)uStack_38);
    }
    sVar3 = znzwrite((void *)((long)&uStack_38 + 4),1,4,fp);
    if (sVar3 == 4) {
      uVar1 = nim->num_ext;
      iVar2 = 4;
      if (0 < (int)uVar1) {
        buf = nim->ext_list;
        uVar4 = 0;
        do {
          sVar3 = znzwrite(buf,1,4,fp);
          if (((int)sVar3 != 4) || (sVar3 = znzwrite(&buf->ecode,1,4,fp), (int)sVar3 != 4)) {
LAB_00113f2a:
            __format = "** failed while writing extension #%d\n";
            goto LAB_00113f37;
          }
          sVar3 = znzwrite(buf->edata,1,(long)buf->esize - 8,fp);
          iVar2 = (int)sVar3;
          if (buf->esize + -8 != iVar2) goto LAB_00113f2a;
          if (2 < g_opts_0) {
            iVar2 = fprintf(_stderr,"+d wrote extension %d of %d bytes\n",(ulong)uVar4,
                            sVar3 & 0xffffffff);
          }
          uVar4 = uVar4 + 1;
          uVar1 = nim->num_ext;
          buf = buf + 1;
        } while ((int)uVar4 < (int)uVar1);
      }
      if (1 < g_opts_0) {
        __format = "+d wrote out %d extension(s)\n";
        uVar4 = uVar1;
LAB_00113f37:
        iVar2 = fprintf(_stderr,__format,(ulong)uVar4);
      }
    }
    else {
      nifti_write_extensions_cold_2();
      iVar2 = extraout_EAX_01;
    }
  }
  else if (1 < g_opts_0) {
    nifti_write_extensions_cold_1();
    iVar2 = extraout_EAX;
  }
  return iVar2;
}

Assistant:

static int nifti_write_extensions(znzFile fp, nifti_image *nim)
{
   nifti1_extension * list;
   char               extdr[4] = { 0, 0, 0, 0 };
   int                c, size, ok = 1;

   if( znz_isnull(fp) || !nim || nim->num_ext < 0 ){
      if( g_opts.debug > 0 )
         fprintf(stderr,"** nifti_write_extensions, bad params\n");
      return -1;
   }

   /* if no extensions and user requests it, skip extender */
   if( g_opts.skip_blank_ext && (nim->num_ext == 0 || ! nim->ext_list ) ){
      if( g_opts.debug > 1 )
         fprintf(stderr,"-d no exts and skip_blank_ext set, "
                        "so skipping 4-byte extender\n");
      return 0;
   }

   /* if invalid extension list, clear num_ext */
   if( ! valid_nifti_extensions(nim) ) nim->num_ext = 0;

   /* write out extender block */
   if( nim->num_ext > 0 ) extdr[0] = 1;
   if( nifti_write_buffer(fp, extdr, 4) != 4 ){
      fprintf(stderr,"** failed to write extender\n");
      return -1;
   }

   list = nim->ext_list;
   for ( c = 0; c < nim->num_ext; c++ ){
      size = (int)nifti_write_buffer(fp, &list->esize, sizeof(int));
      ok = (size == (int)sizeof(int));
      if( ok ){
         size = (int)nifti_write_buffer(fp, &list->ecode, sizeof(int));
         ok = (size == (int)sizeof(int));
      }
      if( ok ){
         size = (int)nifti_write_buffer(fp, list->edata, list->esize - 8);
         ok = (size == list->esize - 8);
      }

      if( !ok ){
         fprintf(stderr,"** failed while writing extension #%d\n",c);
         return -1;
      } else if ( g_opts.debug > 2 )
         fprintf(stderr,"+d wrote extension %d of %d bytes\n", c, size);

      list++;
   }

   if( g_opts.debug > 1 )
      fprintf(stderr,"+d wrote out %d extension(s)\n", nim->num_ext);

   return nim->num_ext;
}